

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymt.cpp
# Opt level: O1

void ymt::UpdateUsers(void)

{
  pointer pcVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  size_t stop;
  long *plVar5;
  long lVar6;
  undefined8 uVar7;
  _Alloc_hider _Var8;
  pointer this;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  YAML l;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  yaml_content;
  Parser user;
  Parser default_config;
  allocator_type local_609;
  YAML local_608;
  string local_5c0;
  string local_5a0;
  string local_580;
  string local_560;
  string local_540;
  string local_520;
  string local_500;
  string local_4e0;
  string local_4c0;
  string local_4a0;
  string local_480;
  string local_460;
  string local_440;
  string local_420;
  string local_400;
  string local_3e0;
  string local_3c0;
  string local_3a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_380;
  pointer local_378;
  string local_370;
  string local_350;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_330;
  undefined1 local_318 [32];
  _Alloc_hider local_2f8;
  char local_2e8 [16];
  _Alloc_hider local_2d8;
  char local_2c8 [16];
  _Alloc_hider local_2b8;
  char local_2a8 [16];
  _Alloc_hider local_298;
  char local_288 [16];
  _Alloc_hider local_278;
  char local_268 [16];
  _Alloc_hider local_258;
  char local_248 [16];
  _Alloc_hider local_238;
  char local_228 [16];
  _Alloc_hider local_218 [2];
  long local_208 [11];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1b0;
  Parser local_198;
  
  Parser::Parser(&local_198);
  local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_350,config__abi_cxx11_._M_dataplus._M_p,
             config__abi_cxx11_._M_dataplus._M_p + config__abi_cxx11_._M_string_length);
  util::ReadFile(&local_330,&local_350);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_350._M_dataplus._M_p != &local_350.field_2) {
    operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
  }
  local_378 = local_330.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (local_330.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_330.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_380 = &local_4a0.field_2;
    this = local_330.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
    do {
      if (this->_M_string_length != 0) {
        stop = std::__cxx11::string::find((char *)this,0x117e40,0);
        if (stop != 0xffffffffffffffff) {
          local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
          pcVar1 = (this->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_3a0,pcVar1,pcVar1 + this->_M_string_length);
          util::SubString((string *)local_318,&local_3a0,0,stop);
          std::__cxx11::string::operator=((string *)this,(string *)local_318);
          if ((undefined1 *)local_318._0_8_ != local_318 + 0x10) {
            operator_delete((void *)local_318._0_8_,local_318._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
            operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1);
          }
        }
        if (this->_M_string_length != 0) {
          local_3c0._M_dataplus._M_p = (pointer)&local_3c0.field_2;
          pcVar1 = (this->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_3c0,pcVar1,pcVar1 + this->_M_string_length);
          util::DecodeYamlLine(&local_608,&local_3c0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
            operator_delete(local_3c0._M_dataplus._M_p,local_3c0.field_2._M_allocated_capacity + 1);
          }
          if (local_608.level == 0) {
            local_440._M_dataplus._M_p = (pointer)&local_440.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_440,local_608.left._M_dataplus._M_p,
                       local_608.left._M_dataplus._M_p + local_608.left._M_string_length);
            local_318._0_8_ = local_318 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_318,"group","");
            local_2f8._M_p = local_2e8;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"nameserver","");
            local_2d8._M_p = local_2c8;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"method","");
            local_2b8._M_p = local_2a8;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"fastopen","");
            local_298._M_p = local_288;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"redirect","");
            local_278._M_p = local_268;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"timeout","");
            local_258._M_p = local_248;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"server","");
            local_238._M_p = local_228;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"tunnel_mode","");
            local_218[0]._M_p = (pointer)local_208;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_218,"verbose","");
            __l._M_len = 9;
            __l._M_array = (iterator)local_318;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector(&local_1b0,__l,&local_609);
            iVar4 = util::MatchWithWords(&local_440,&local_1b0);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_1b0);
            lVar6 = -0x120;
            plVar5 = local_208;
            do {
              if (plVar5 != (long *)plVar5[-2]) {
                operator_delete((long *)plVar5[-2],*plVar5 + 1);
              }
              plVar5 = plVar5 + -4;
              lVar6 = lVar6 + 0x20;
            } while (lVar6 != 0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_440._M_dataplus._M_p != &local_440.field_2) {
              operator_delete(local_440._M_dataplus._M_p,local_440.field_2._M_allocated_capacity + 1
                             );
            }
            switch(iVar4) {
            case 0:
              local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_460,local_608.right._M_dataplus._M_p,
                         local_608.right._M_dataplus._M_p + local_608.right._M_string_length);
              Parser::SetAttribute(&local_198,GROUP_NAME,&local_460);
              uVar7 = local_460.field_2._M_allocated_capacity;
              _Var8._M_p = local_460._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_460._M_dataplus._M_p != &local_460.field_2) {
LAB_0010e734:
                operator_delete(_Var8._M_p,uVar7 + 1);
              }
              break;
            case 1:
              local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_480,"localhost","");
              local_3e0._M_dataplus._M_p = (pointer)&local_3e0.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_3e0,local_608.right._M_dataplus._M_p,
                         local_608.right._M_dataplus._M_p + local_608.right._M_string_length);
              bVar2 = util::IsTheSame(&local_480,&local_3e0,false,false);
              bVar3 = true;
              if (!bVar2) {
                local_4a0._M_dataplus._M_p = (pointer)&local_4a0.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_4a0,"bind9-local","");
                local_400._M_dataplus._M_p = (pointer)&local_400.field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_400,local_608.right._M_dataplus._M_p,
                           local_608.right._M_dataplus._M_p + local_608.right._M_string_length);
                bVar3 = util::IsTheSame(&local_4a0,&local_400,false,false);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_400._M_dataplus._M_p != &local_400.field_2) {
                  operator_delete(local_400._M_dataplus._M_p,
                                  local_400.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
                  operator_delete(local_4a0._M_dataplus._M_p,
                                  local_4a0.field_2._M_allocated_capacity + 1);
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
                operator_delete(local_3e0._M_dataplus._M_p,
                                local_3e0.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_480._M_dataplus._M_p != &local_480.field_2) {
                operator_delete(local_480._M_dataplus._M_p,
                                local_480.field_2._M_allocated_capacity + 1);
              }
              if (bVar3 == false) {
                local_4c0._M_dataplus._M_p = (pointer)&local_4c0.field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_4c0,local_608.right._M_dataplus._M_p,
                           local_608.right._M_dataplus._M_p + local_608.right._M_string_length);
                Parser::SetAttribute(&local_198,DNS,&local_4c0);
                uVar7 = local_4c0.field_2._M_allocated_capacity;
                _Var8._M_p = local_4c0._M_dataplus._M_p;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_4c0._M_dataplus._M_p != &local_4c0.field_2) goto LAB_0010e734;
              }
              else {
                util::GetMachineIP_abi_cxx11_();
                Parser::SetAttribute(&local_198,DNS,&local_370);
                uVar7 = local_370.field_2._M_allocated_capacity;
                _Var8._M_p = local_370._M_dataplus._M_p;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_370._M_dataplus._M_p != &local_370.field_2) goto LAB_0010e734;
              }
              break;
            case 2:
              local_4e0._M_dataplus._M_p = (pointer)&local_4e0.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_4e0,local_608.right._M_dataplus._M_p,
                         local_608.right._M_dataplus._M_p + local_608.right._M_string_length);
              Parser::SetAttribute(&local_198,METHOD,&local_4e0);
              uVar7 = local_4e0.field_2._M_allocated_capacity;
              _Var8._M_p = local_4e0._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4e0._M_dataplus._M_p != &local_4e0.field_2) goto LAB_0010e734;
              break;
            case 3:
              local_500._M_dataplus._M_p = (pointer)&local_500.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_500,local_608.right._M_dataplus._M_p,
                         local_608.right._M_dataplus._M_p + local_608.right._M_string_length);
              Parser::SetAttribute(&local_198,TCP_FASTOPEN,&local_500);
              uVar7 = local_500.field_2._M_allocated_capacity;
              _Var8._M_p = local_500._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_500._M_dataplus._M_p != &local_500.field_2) goto LAB_0010e734;
              break;
            case 4:
              local_520._M_dataplus._M_p = (pointer)&local_520.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_520,local_608.right._M_dataplus._M_p,
                         local_608.right._M_dataplus._M_p + local_608.right._M_string_length);
              Parser::SetAttribute(&local_198,REDIRECT,&local_520);
              uVar7 = local_520.field_2._M_allocated_capacity;
              _Var8._M_p = local_520._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_520._M_dataplus._M_p != &local_520.field_2) goto LAB_0010e734;
              break;
            case 5:
              local_540._M_dataplus._M_p = (pointer)&local_540.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_540,local_608.right._M_dataplus._M_p,
                         local_608.right._M_dataplus._M_p + local_608.right._M_string_length);
              Parser::SetAttribute(&local_198,TIMEOUT,&local_540);
              uVar7 = local_540.field_2._M_allocated_capacity;
              _Var8._M_p = local_540._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_540._M_dataplus._M_p != &local_540.field_2) goto LAB_0010e734;
              break;
            case 6:
              local_560._M_dataplus._M_p = (pointer)&local_560.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_560,local_608.right._M_dataplus._M_p,
                         local_608.right._M_dataplus._M_p + local_608.right._M_string_length);
              Parser::SetAttribute(&local_198,SERVER,&local_560);
              uVar7 = local_560.field_2._M_allocated_capacity;
              _Var8._M_p = local_560._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_560._M_dataplus._M_p != &local_560.field_2) goto LAB_0010e734;
              break;
            case 7:
              local_580._M_dataplus._M_p = (pointer)&local_580.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_580,local_608.right._M_dataplus._M_p,
                         local_608.right._M_dataplus._M_p + local_608.right._M_string_length);
              Parser::SetAttribute(&local_198,UDP_OR_TCP,&local_580);
              uVar7 = local_580.field_2._M_allocated_capacity;
              _Var8._M_p = local_580._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_580._M_dataplus._M_p != &local_580.field_2) goto LAB_0010e734;
              break;
            case 8:
              local_5a0._M_dataplus._M_p = (pointer)&local_5a0.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_5a0,local_608.right._M_dataplus._M_p,
                         local_608.right._M_dataplus._M_p + local_608.right._M_string_length);
              Parser::SetAttribute(&local_198,VERBOSE,&local_5a0);
              uVar7 = local_5a0.field_2._M_allocated_capacity;
              _Var8._M_p = local_5a0._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_5a0._M_dataplus._M_p != &local_5a0.field_2) goto LAB_0010e734;
            }
          }
          else {
            Parser::Parser((Parser *)local_318,&local_198);
            local_5c0._M_dataplus._M_p = (pointer)&local_5c0.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_5c0,local_608.left._M_dataplus._M_p,
                       local_608.left._M_dataplus._M_p + local_608.left._M_string_length);
            local_420._M_dataplus._M_p = (pointer)&local_420.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_420,local_608.right._M_dataplus._M_p,
                       local_608.right._M_dataplus._M_p + local_608.right._M_string_length);
            Parser::SetUser((Parser *)local_318,&local_5c0,&local_420);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_420._M_dataplus._M_p != &local_420.field_2) {
              operator_delete(local_420._M_dataplus._M_p,local_420.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_5c0._M_dataplus._M_p != &local_5c0.field_2) {
              operator_delete(local_5c0._M_dataplus._M_p,local_5c0.field_2._M_allocated_capacity + 1
                             );
            }
            std::vector<Parser,_std::allocator<Parser>_>::push_back(&users_,(value_type *)local_318)
            ;
            Parser::~Parser((Parser *)local_318);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_608.right._M_dataplus._M_p != &local_608.right.field_2) {
            operator_delete(local_608.right._M_dataplus._M_p,
                            local_608.right.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_608.left._M_dataplus._M_p != &local_608.left.field_2) {
            operator_delete(local_608.left._M_dataplus._M_p,
                            local_608.left.field_2._M_allocated_capacity + 1);
          }
        }
      }
      this = this + 1;
    } while (this != local_378);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_330);
  Parser::~Parser(&local_198);
  return;
}

Assistant:

void ymt::UpdateUsers() {

	//Make template configuration (Can be modified by config)
	Parser default_config;

	//Read raw config
	vector <string> yaml_content = util::ReadFile(config_);

	//Parse YAML
	for (string& line : yaml_content) {

		//Skip blanklines & comments
		if (line.empty()) continue;
		else {
			size_t slash_pos = line.find("//");
			if (slash_pos != -1) {
				line = util::SubString(line, 0, slash_pos);
			}
			if (line.empty()) continue;
		}


		YAML l = util::DecodeYamlLine(line);

		//If it is global level -- no user
		if (l.level == 0) {
			switch (util::MatchWithWords(l.left,
										 { "group",
										  "nameserver",
										  "method",
										  "fastopen",
										  "redirect",
										  "timeout",
										  "server",
										  "tunnel_mode",
										  "verbose" })) {
			case 0:
				default_config.SetAttribute(GROUP_NAME, l.right);
				break;
			case 1:
				if (util::IsTheSame("localhost", l.right, false, false) ||
					util::IsTheSame("bind9-local", l.right, false, false)) {
					default_config.SetAttribute(DNS, util::GetMachineIP());
				}
				else {
					default_config.SetAttribute(DNS, l.right);
				}
				break;
			case 2:
				default_config.SetAttribute(METHOD, l.right);
				break;
			case 3:
				default_config.SetAttribute(TCP_FASTOPEN, l.right);
				break;
			case 4:
				default_config.SetAttribute(REDIRECT, l.right);
				break;
			case 5:
				default_config.SetAttribute(TIMEOUT, l.right);
				break;
			case 6:
				default_config.SetAttribute(SERVER, l.right);
				break;
			case 7:
				default_config.SetAttribute(UDP_OR_TCP, l.right);
				break;
			case 8:
				default_config.SetAttribute(VERBOSE, l.right);
				break;

			default:
				break;
			}
		}
		else {
			Parser user = default_config;
			user.SetUser(l.left, l.right);
			users_.push_back(user);
		}
	}
}